

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

void compactor_get_virtual_filename(char *filename,char *virtual_filename)

{
  int iVar1;
  
  iVar1 = _compactor_prefix_len(filename);
  if (1 < iVar1) {
    strncpy(virtual_filename,filename,(ulong)(iVar1 - 1));
    virtual_filename[iVar1 - 1] = '\0';
    return;
  }
  strcpy(virtual_filename,filename);
  return;
}

Assistant:

void compactor_get_virtual_filename(const char *filename,
                                    char *virtual_filename)
{
    int prefix_len = _compactor_prefix_len((char*)filename) - 1;
    if (prefix_len > 0) {
        strncpy(virtual_filename, filename, prefix_len);
        virtual_filename[prefix_len] = 0;
    } else {
        strcpy(virtual_filename, filename);
    }
}